

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O3

Function * root(Function *left,Function *right)

{
  FunctionType FVar1;
  FunctionType FVar2;
  Function *pFVar3;
  
  FVar1 = left->eType;
  FVar2 = right->eType;
  if (FVar2 != EMPTY || FVar1 != EMPTY) {
    pFVar3 = right;
    if ((FVar1 != EMPTY || FVar2 == EMPTY) && (pFVar3 = left, FVar1 == EMPTY || FVar2 != EMPTY)) {
      pFVar3 = (Function *)operator_new(400);
      Function::Function(pFVar3,left,right,ROOT);
    }
    return pFVar3;
  }
  pFVar3 = empty();
  return pFVar3;
}

Assistant:

Function &root( Function &left, Function &right )
{	
	if (left.eType==EMPTY && right.eType==EMPTY)
		return empty();
	if (left.eType==EMPTY && right.eType!=EMPTY)
		return right;
	if (left.eType!=EMPTY && right.eType==EMPTY)
		return left;
	return *(new Function(left, right, ROOT));
}